

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O0

void __thiscall
slang::ast::PrimitiveSymbol::PrimitiveSymbol
          (PrimitiveSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          PrimitiveKind primitiveKind)

{
  PrimitiveKind primitiveKind_local;
  Compilation *compilation_local;
  PrimitiveSymbol *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  Symbol::Symbol(&this->super_Symbol,Primitive,name,loc);
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  nonstd::span_lite::span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL>::
  span<true,_0>(&this->ports);
  this->initVal = (ConstantValue *)0x0;
  this->isSequential = false;
  this->primitiveKind = primitiveKind;
  return;
}

Assistant:

PrimitiveSymbol(Compilation& compilation, string_view name, SourceLocation loc,
                    PrimitiveKind primitiveKind) :
        Symbol(SymbolKind::Primitive, name, loc),
        Scope(compilation, this), primitiveKind(primitiveKind) {}